

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

IceTBoolean icetMatrixInverseTranspose(IceTDouble *matrix_in,IceTDouble *matrix_out)

{
  IceTBoolean IVar1;
  int rowIdx;
  long lVar2;
  long lVar3;
  IceTDouble *pIVar4;
  IceTDouble inverse [16];
  IceTDouble local_98 [17];
  
  pIVar4 = local_98;
  IVar1 = icetMatrixInverse(matrix_in,local_98);
  if (IVar1 == '\0') {
    IVar1 = '\0';
  }
  else {
    lVar2 = 0;
    do {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)matrix_out + lVar3 * 4) = *(undefined8 *)((long)pIVar4 + lVar3);
        lVar3 = lVar3 + 8;
      } while (lVar3 != 0x20);
      lVar2 = lVar2 + 1;
      pIVar4 = (IceTDouble *)((long)pIVar4 + 0x20);
      matrix_out = matrix_out + 1;
    } while (lVar2 != 4);
    IVar1 = '\x01';
  }
  return IVar1;
}

Assistant:

IceTBoolean icetMatrixInverseTranspose(const IceTDouble *matrix_in,
                                       IceTDouble *matrix_out)
{
    IceTDouble inverse[16];
    IceTBoolean success;

    success = icetMatrixInverse(matrix_in, inverse);
    if (!success) return ICET_FALSE;

    icetMatrixTranspose((const IceTDouble *)inverse, matrix_out);
    return ICET_TRUE;
}